

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

void ixxx::posix::spawn_file_actions_addclose(posix_spawn_file_actions_t *as,int fd)

{
  int iVar1;
  spawn_file_actions_addclose_error *this;
  
  iVar1 = posix_spawn_file_actions_addclose((posix_spawn_file_actions_t *)as,fd);
  if (iVar1 == 0) {
    return;
  }
  this = (spawn_file_actions_addclose_error *)__cxa_allocate_exception(0x20);
  spawn_file_actions_addclose_error::sys_error(this,iVar1,(char *)0x0,ERRNO);
  __cxa_throw(this,&spawn_file_actions_addclose_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void spawn_file_actions_addclose(posix_spawn_file_actions_t *as, int fd)
    {
        int r = ::posix_spawn_file_actions_addclose(as, fd);
        if (r)
            throw spawn_file_actions_addclose_error(r);
    }